

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

void __thiscall google::anon_unknown_3::FileDescriptor::~FileDescriptor(FileDescriptor *this)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  FileDescriptor *this_local;
  
  if (-1 < this->fd_) {
    do {
      iVar1 = close(this->fd_);
      bVar3 = false;
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
  }
  return;
}

Assistant:

~FileDescriptor() {
    if (fd_ >= 0) {
      NO_INTR(close(fd_));
    }
  }